

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase195::run(TestCase195 *this)

{
  word **this_00;
  uint uVar1;
  uint uVar2;
  Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_> *value;
  undefined1 local_210 [8];
  Builder root;
  bool local_1dd;
  uint local_1dc;
  uint uStack_1d8;
  bool _kj_shouldLog_1;
  bool local_1d1;
  uint local_1d0;
  uint uStack_1cc;
  bool _kj_shouldLog;
  Fault local_1c8;
  Fault f;
  Reader reader;
  BuilderFor<capnp::List<unsigned_int,_(capnp::Kind)0>_> local_168;
  Orphanage local_130;
  undefined1 local_120 [8];
  Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_> orphan;
  MallocMessageBuilder builder;
  TestCase195 *this_local;
  
  this_00 = &orphan.builder.location;
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)this_00,0x400,GROW_HEURISTICALLY);
  local_130 = MessageBuilder::getOrphanage((MessageBuilder *)this_00);
  Orphanage::newOrphan<capnp::List<unsigned_int,(capnp::Kind)0>>
            ((Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_> *)local_120,&local_130,2);
  Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_>::get
            (&local_168,(Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_> *)local_120);
  List<unsigned_int,_(capnp::Kind)0>::Builder::set(&local_168,0,0x7b);
  Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_>::get
            ((BuilderFor<capnp::List<unsigned_int,_(capnp::Kind)0>_> *)&reader.reader.nestingLimit,
             (Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_> *)local_120);
  List<unsigned_int,_(capnp::Kind)0>::Builder::set((Builder *)&reader.reader.nestingLimit,1,0x1c8);
  Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_>::getReader
            ((ReaderFor<capnp::List<unsigned_int,_(capnp::Kind)0>_> *)&f,
             (Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_> *)local_120);
  uVar1 = List<unsigned_int,_(capnp::Kind)0>::Reader::size((Reader *)&f);
  if (uVar1 != 2) {
    uStack_1cc = 2;
    local_1d0 = List<unsigned_int,_(capnp::Kind)0>::Reader::size((Reader *)&f);
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              (&local_1c8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0xcb,FAILED,"(2u) == (reader.size())","2u, reader.size()",&stack0xfffffffffffffe34,
               &local_1d0);
    kj::_::Debug::Fault::fatal(&local_1c8);
  }
  uVar2 = List<unsigned_int,_(capnp::Kind)0>::Reader::operator[]((Reader *)&f,0);
  if (uVar2 != 0x7b) {
    local_1d1 = kj::_::Debug::shouldLog(ERROR);
    while (local_1d1 != false) {
      uStack_1d8 = 0x7b;
      local_1dc = List<unsigned_int,_(capnp::Kind)0>::Reader::operator[]((Reader *)&f,0);
      kj::_::Debug::log<char_const(&)[39],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0xcc,ERROR,"\"failed: expected \" \"(123u) == (reader[0])\", 123u, reader[0]",
                 (char (*) [39])"failed: expected (123u) == (reader[0])",&stack0xfffffffffffffe28,
                 &local_1dc);
      local_1d1 = false;
    }
  }
  uVar2 = List<unsigned_int,_(capnp::Kind)0>::Reader::operator[]((Reader *)&f,1);
  if (uVar2 != 0x1c8) {
    local_1dd = kj::_::Debug::shouldLog(ERROR);
    while (local_1dd != false) {
      root._builder.pointerCount = 0x1c8;
      root._builder._38_2_ = 0;
      root._builder.dataSize =
           List<unsigned_int,_(capnp::Kind)0>::Reader::operator[]((Reader *)&f,1);
      kj::_::Debug::log<char_const(&)[39],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0xcd,ERROR,"\"failed: expected \" \"(456u) == (reader[1])\", 456u, reader[1]",
                 (char (*) [39])"failed: expected (456u) == (reader[1])",
                 (uint *)&root._builder.pointerCount,&root._builder.dataSize);
      local_1dd = false;
    }
  }
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAllTypes>
            ((Builder *)local_210,(MessageBuilder *)&orphan.builder.location);
  value = kj::mv<capnp::Orphan<capnp::List<unsigned_int,(capnp::Kind)0>>>
                    ((Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_> *)local_120);
  capnproto_test::capnp::test::TestAllTypes::Builder::adoptUInt32List((Builder *)local_210,value);
  Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_>::~Orphan
            ((Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_> *)local_120);
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&orphan.builder.location);
  return;
}

Assistant:

TEST(Orphans, OrphanageList) {
  MallocMessageBuilder builder;

  Orphan<List<uint32_t>> orphan = builder.getOrphanage().newOrphan<List<uint32_t>>(2);
  orphan.get().set(0, 123);
  orphan.get().set(1, 456);

  List<uint32_t>::Reader reader = orphan.getReader();
  ASSERT_EQ(2u, reader.size());
  EXPECT_EQ(123u, reader[0]);
  EXPECT_EQ(456u, reader[1]);

  auto root = builder.initRoot<TestAllTypes>();
  root.adoptUInt32List(kj::mv(orphan));
}